

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O0

uint If_ManSatCheckXYall_int(void *pSat,int nLutSize,word *pTruth,int nVars,Vec_Int_t *vLits)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int local_78;
  int local_74;
  int s [4];
  int i [6];
  int nShared;
  int nTotal;
  uint uSet;
  Vec_Int_t *vLits_local;
  int nVars_local;
  word *pTruth_local;
  int nLutSize_local;
  void *pSat_local;
  
  iVar2 = nLutSize * 2 + -1;
  iVar3 = iVar2 - nVars;
  if ((nLutSize < 2) || (6 < nLutSize)) {
    __assert_fail("nLutSize >= 2 && nLutSize <= 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifSat.c"
                  ,0x10d,
                  "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)");
  }
  if ((nVars <= nLutSize) || (iVar2 < nVars)) {
    __assert_fail("nLutSize < nVars && nVars <= nTotal",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifSat.c"
                  ,0x10e,
                  "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)");
  }
  if ((iVar3 < 0) || (nLutSize + -1 <= iVar3)) {
    __assert_fail("nShared >= 0 && nShared < nLutSize - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifSat.c"
                  ,0x10f,
                  "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)");
  }
  if (nLutSize == 2) {
    if (iVar2 != nVars) {
      __assert_fail("nShared == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifSat.c"
                    ,0x112,
                    "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)");
    }
    for (s[2] = 0; s[3] = s[2], s[2] < nVars; s[2] = s[2] + 1) {
      while (s[3] = s[3] + 1, s[3] < nVars) {
        uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((char)s[3] * '\x02' & 0x1fU);
        iVar2 = If_ManSatCheckXY(pSat,2,pTruth,nVars,uVar4,(word *)0x0,(word *)0x0,vLits);
        if (iVar2 != 0) {
          return uVar4;
        }
      }
    }
  }
  else if (nLutSize == 3) {
    for (s[2] = 0; iVar2 = s[2], s[2] < nVars; s[2] = s[2] + 1) {
      while (s[3] = iVar2 + 1, s[3] < nVars) {
        for (i[0] = iVar2 + 2; iVar2 = s[3], i[0] < nVars; i[0] = i[0] + 1) {
          uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((byte)(s[3] << 1) & 0x1f) |
                  1 << ((byte)(i[0] << 1) & 0x1f);
          iVar2 = If_ManSatCheckXY(pSat,3,pTruth,nVars,uVar4,(word *)0x0,(word *)0x0,vLits);
          if (iVar2 != 0) {
            return uVar4;
          }
        }
      }
    }
    if (iVar3 < 1) {
      return 0;
    }
    for (s[2] = 0; s[2] < nVars; s[2] = s[2] + 1) {
      for (s[3] = s[2] + 1; i[0] = s[3], s[3] < nVars; s[3] = s[3] + 1) {
        while (i[0] = i[0] + 1, i[0] < nVars) {
          uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((byte)(s[3] << 1) & 0x1f) |
                  1 << ((char)i[0] * '\x02' & 0x1fU);
          for (local_78 = 0; local_78 < 3; local_78 = local_78 + 1) {
            iVar2 = If_ManSatCheckXY(pSat,3,pTruth,nVars,
                                     uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f),
                                     (word *)0x0,(word *)0x0,vLits);
            if (iVar2 != 0) {
              return uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f);
            }
          }
        }
      }
    }
  }
  else if (nLutSize == 4) {
    for (s[2] = 0; iVar2 = s[2], s[2] < nVars; s[2] = s[2] + 1) {
      while (s[3] = iVar2 + 1, s[3] < nVars) {
        for (i[0] = iVar2 + 2; iVar2 = s[3], i[1] = i[0], i[0] < nVars; i[0] = i[0] + 1) {
          while (i[1] = i[1] + 1, i[1] < nVars) {
            uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((byte)(s[3] << 1) & 0x1f) |
                    1 << ((byte)(i[0] << 1) & 0x1f) | 1 << ((char)i[1] * '\x02' & 0x1fU);
            iVar2 = If_ManSatCheckXY(pSat,4,pTruth,nVars,uVar4,(word *)0x0,(word *)0x0,vLits);
            if (iVar2 != 0) {
              return uVar4;
            }
          }
        }
      }
    }
    if (iVar3 < 1) {
      return 0;
    }
    for (s[2] = 0; s[2] < nVars; s[2] = s[2] + 1) {
      for (s[3] = s[2] + 1; iVar2 = s[3], s[3] < nVars; s[3] = s[3] + 1) {
        while (i[0] = iVar2 + 1, i[0] < nVars) {
          for (i[1] = iVar2 + 2; iVar2 = i[0], i[1] < nVars; i[1] = i[1] + 1) {
            uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((byte)(s[3] << 1) & 0x1f) |
                    1 << ((char)i[0] * '\x02' & 0x1fU) | 1 << ((byte)(i[1] << 1) & 0x1f);
            for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
              iVar2 = If_ManSatCheckXY(pSat,4,pTruth,nVars,
                                       uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f),
                                       (word *)0x0,(word *)0x0,vLits);
              if (iVar2 != 0) {
                return uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f);
              }
            }
          }
        }
      }
    }
    if (iVar3 < 2) {
      return 0;
    }
    for (s[2] = 0; s[2] < nVars; s[2] = s[2] + 1) {
      for (s[3] = s[2] + 1; iVar2 = s[3], s[3] < nVars; s[3] = s[3] + 1) {
        while (i[0] = iVar2 + 1, i[0] < nVars) {
          for (i[1] = iVar2 + 2; iVar2 = i[0], i[1] < nVars; i[1] = i[1] + 1) {
            uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((byte)(s[3] << 1) & 0x1f) |
                    1 << ((char)i[0] * '\x02' & 0x1fU) | 1 << ((byte)(i[1] << 1) & 0x1f);
            for (local_78 = 0; local_74 = local_78, local_78 < 4; local_78 = local_78 + 1) {
              while (local_74 = local_74 + 1, local_74 < 4) {
                iVar2 = If_ManSatCheckXY(pSat,4,pTruth,nVars,
                                         uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f) |
                                         3 << ((byte)(s[(long)local_74 + 2] << 1) & 0x1f),
                                         (word *)0x0,(word *)0x0,vLits);
                if (iVar2 != 0) {
                  return uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f) |
                         3 << ((byte)(s[(long)local_74 + 2] << 1) & 0x1f);
                }
              }
            }
          }
        }
      }
    }
  }
  else if (nLutSize == 5) {
    for (s[2] = 0; iVar2 = s[2], s[2] < nVars; s[2] = s[2] + 1) {
      while (s[3] = iVar2 + 1, s[3] < nVars) {
        for (i[0] = iVar2 + 2; iVar2 = s[3], iVar1 = i[0], i[0] < nVars; i[0] = i[0] + 1) {
          while (i[1] = iVar1 + 1, i[1] < nVars) {
            for (i[2] = iVar1 + 2; iVar1 = i[1], i[2] < nVars; i[2] = i[2] + 1) {
              uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((byte)(s[3] << 1) & 0x1f) |
                      1 << ((byte)(i[0] << 1) & 0x1f) | 1 << ((char)i[1] * '\x02' & 0x1fU) |
                      1 << ((byte)(i[2] << 1) & 0x1f);
              iVar2 = If_ManSatCheckXY(pSat,5,pTruth,nVars,uVar4,(word *)0x0,(word *)0x0,vLits);
              if (iVar2 != 0) {
                return uVar4;
              }
            }
          }
        }
      }
    }
    if (iVar3 < 1) {
      return 0;
    }
    for (s[2] = 0; s[2] < nVars; s[2] = s[2] + 1) {
      for (s[3] = s[2] + 1; iVar2 = s[3], s[3] < nVars; s[3] = s[3] + 1) {
        while (i[0] = iVar2 + 1, i[0] < nVars) {
          for (i[1] = iVar2 + 2; iVar2 = i[0], i[2] = i[1], i[1] < nVars; i[1] = i[1] + 1) {
            while (i[2] = i[2] + 1, i[2] < nVars) {
              uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((byte)(s[3] << 1) & 0x1f) |
                      1 << ((char)i[0] * '\x02' & 0x1fU) | 1 << ((byte)(i[1] << 1) & 0x1f) |
                      1 << ((char)i[2] * '\x02' & 0x1fU);
              for (local_78 = 0; local_78 < 5; local_78 = local_78 + 1) {
                iVar2 = If_ManSatCheckXY(pSat,5,pTruth,nVars,
                                         uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f),
                                         (word *)0x0,(word *)0x0,vLits);
                if (iVar2 != 0) {
                  return uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f);
                }
              }
            }
          }
        }
      }
    }
    if (iVar3 < 2) {
      return 0;
    }
    for (s[2] = 0; s[2] < nVars; s[2] = s[2] + 1) {
      for (s[3] = s[2] + 1; iVar2 = s[3], s[3] < nVars; s[3] = s[3] + 1) {
        while (i[0] = iVar2 + 1, i[0] < nVars) {
          for (i[1] = iVar2 + 2; iVar2 = i[0], i[2] = i[1], i[1] < nVars; i[1] = i[1] + 1) {
            while (i[2] = i[2] + 1, i[2] < nVars) {
              uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((byte)(s[3] << 1) & 0x1f) |
                      1 << ((char)i[0] * '\x02' & 0x1fU) | 1 << ((byte)(i[1] << 1) & 0x1f) |
                      1 << ((char)i[2] * '\x02' & 0x1fU);
              for (local_78 = 0; local_74 = local_78, local_78 < 5; local_78 = local_78 + 1) {
                while (local_74 = local_74 + 1, local_74 < 5) {
                  iVar2 = If_ManSatCheckXY(pSat,5,pTruth,nVars,
                                           uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f)
                                           | 3 << ((byte)(s[(long)local_74 + 2] << 1) & 0x1f),
                                           (word *)0x0,(word *)0x0,vLits);
                  if (iVar2 != 0) {
                    return uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f) |
                           3 << ((byte)(s[(long)local_74 + 2] << 1) & 0x1f);
                  }
                }
              }
            }
          }
        }
      }
    }
    if (iVar3 < 3) {
      return 0;
    }
    for (s[2] = 0; s[2] < nVars; s[2] = s[2] + 1) {
      for (s[3] = s[2] + 1; iVar2 = s[3], s[3] < nVars; s[3] = s[3] + 1) {
        while (i[0] = iVar2 + 1, i[0] < nVars) {
          for (i[1] = iVar2 + 2; iVar2 = i[0], i[2] = i[1], i[1] < nVars; i[1] = i[1] + 1) {
            while (i[2] = i[2] + 1, i[2] < nVars) {
              uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((byte)(s[3] << 1) & 0x1f) |
                      1 << ((char)i[0] * '\x02' & 0x1fU) | 1 << ((byte)(i[1] << 1) & 0x1f) |
                      1 << ((char)i[2] * '\x02' & 0x1fU);
              for (local_78 = 0; iVar2 = local_78, local_78 < 5; local_78 = local_78 + 1) {
                while (local_74 = iVar2 + 1, local_74 < 5) {
                  for (s[0] = iVar2 + 2; iVar2 = local_74, s[0] < 5; s[0] = s[0] + 1) {
                    iVar2 = If_ManSatCheckXY(pSat,5,pTruth,nVars,
                                             uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f
                                                          ) |
                                             3 << ((byte)(s[(long)local_74 + 2] << 1) & 0x1f) |
                                             3 << ((byte)(s[(long)s[0] + 2] << 1) & 0x1f),
                                             (word *)0x0,(word *)0x0,vLits);
                    if (iVar2 != 0) {
                      return uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f) |
                             3 << ((byte)(s[(long)local_74 + 2] << 1) & 0x1f) |
                             3 << ((byte)(s[(long)s[0] + 2] << 1) & 0x1f);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else if (nLutSize == 6) {
    for (s[2] = 0; iVar2 = s[2], s[2] < nVars; s[2] = s[2] + 1) {
      while (s[3] = iVar2 + 1, s[3] < nVars) {
        for (i[0] = iVar2 + 2; iVar2 = s[3], iVar1 = i[0], i[0] < nVars; i[0] = i[0] + 1) {
          while (i[1] = iVar1 + 1, i[1] < nVars) {
            for (i[2] = iVar1 + 2; iVar1 = i[1], i[3] = i[2], i[2] < nVars; i[2] = i[2] + 1) {
              while (i[3] = i[3] + 1, i[3] < nVars) {
                uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((byte)(s[3] << 1) & 0x1f) |
                        1 << ((byte)(i[0] << 1) & 0x1f) | 1 << ((char)i[1] * '\x02' & 0x1fU) |
                        1 << ((byte)(i[2] << 1) & 0x1f) | 1 << ((char)i[3] * '\x02' & 0x1fU);
                iVar2 = If_ManSatCheckXY(pSat,6,pTruth,nVars,uVar4,(word *)0x0,(word *)0x0,vLits);
                if (iVar2 != 0) {
                  return uVar4;
                }
              }
            }
          }
        }
      }
    }
    if (iVar3 < 1) {
      return 0;
    }
    for (s[2] = 0; s[2] < nVars; s[2] = s[2] + 1) {
      for (s[3] = s[2] + 1; iVar2 = s[3], s[3] < nVars; s[3] = s[3] + 1) {
        while (i[0] = iVar2 + 1, i[0] < nVars) {
          for (i[1] = iVar2 + 2; iVar2 = i[0], iVar1 = i[1], i[1] < nVars; i[1] = i[1] + 1) {
            while (i[2] = iVar1 + 1, i[2] < nVars) {
              for (i[3] = iVar1 + 2; iVar1 = i[2], i[3] < nVars; i[3] = i[3] + 1) {
                uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((byte)(s[3] << 1) & 0x1f) |
                        1 << ((char)i[0] * '\x02' & 0x1fU) | 1 << ((byte)(i[1] << 1) & 0x1f) |
                        1 << ((char)i[2] * '\x02' & 0x1fU) | 1 << ((byte)(i[3] << 1) & 0x1f);
                for (local_78 = 0; local_78 < 6; local_78 = local_78 + 1) {
                  iVar2 = If_ManSatCheckXY(pSat,6,pTruth,nVars,
                                           uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f),
                                           (word *)0x0,(word *)0x0,vLits);
                  if (iVar2 != 0) {
                    return uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f);
                  }
                }
              }
            }
          }
        }
      }
    }
    if (iVar3 < 2) {
      return 0;
    }
    for (s[2] = 0; s[2] < nVars; s[2] = s[2] + 1) {
      for (s[3] = s[2] + 1; iVar2 = s[3], s[3] < nVars; s[3] = s[3] + 1) {
        while (i[0] = iVar2 + 1, i[0] < nVars) {
          for (i[1] = iVar2 + 2; iVar2 = i[0], iVar1 = i[1], i[1] < nVars; i[1] = i[1] + 1) {
            while (i[2] = iVar1 + 1, i[2] < nVars) {
              for (i[3] = iVar1 + 2; iVar1 = i[2], i[3] < nVars; i[3] = i[3] + 1) {
                uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((byte)(s[3] << 1) & 0x1f) |
                        1 << ((char)i[0] * '\x02' & 0x1fU) | 1 << ((byte)(i[1] << 1) & 0x1f) |
                        1 << ((char)i[2] * '\x02' & 0x1fU) | 1 << ((byte)(i[3] << 1) & 0x1f);
                for (local_78 = 0; local_74 = local_78, local_78 < 6; local_78 = local_78 + 1) {
                  while (local_74 = local_74 + 1, local_74 < 6) {
                    iVar2 = If_ManSatCheckXY(pSat,6,pTruth,nVars,
                                             uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f
                                                          ) |
                                             3 << ((byte)(s[(long)local_74 + 2] << 1) & 0x1f),
                                             (word *)0x0,(word *)0x0,vLits);
                    if (iVar2 != 0) {
                      return uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f) |
                             3 << ((byte)(s[(long)local_74 + 2] << 1) & 0x1f);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (iVar3 < 3) {
      return 0;
    }
    for (s[2] = 0; s[2] < nVars; s[2] = s[2] + 1) {
      for (s[3] = s[2] + 1; iVar2 = s[3], s[3] < nVars; s[3] = s[3] + 1) {
        while (i[0] = iVar2 + 1, i[0] < nVars) {
          for (i[1] = iVar2 + 2; iVar2 = i[0], iVar1 = i[1], i[1] < nVars; i[1] = i[1] + 1) {
            while (i[2] = iVar1 + 1, i[2] < nVars) {
              for (i[3] = iVar1 + 2; iVar1 = i[2], i[3] < nVars; i[3] = i[3] + 1) {
                uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((byte)(s[3] << 1) & 0x1f) |
                        1 << ((char)i[0] * '\x02' & 0x1fU) | 1 << ((byte)(i[1] << 1) & 0x1f) |
                        1 << ((char)i[2] * '\x02' & 0x1fU) | 1 << ((byte)(i[3] << 1) & 0x1f);
                for (local_78 = 0; iVar2 = local_78, local_78 < 6; local_78 = local_78 + 1) {
                  while (local_74 = iVar2 + 1, local_74 < 6) {
                    for (s[0] = iVar2 + 2; iVar2 = local_74, s[0] < 6; s[0] = s[0] + 1) {
                      iVar2 = If_ManSatCheckXY(pSat,6,pTruth,nVars,
                                               uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) &
                                                            0x1f) |
                                               3 << ((byte)(s[(long)local_74 + 2] << 1) & 0x1f) |
                                               3 << ((byte)(s[(long)s[0] + 2] << 1) & 0x1f),
                                               (word *)0x0,(word *)0x0,vLits);
                      if (iVar2 != 0) {
                        return uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f) |
                               3 << ((byte)(s[(long)local_74 + 2] << 1) & 0x1f) |
                               3 << ((byte)(s[(long)s[0] + 2] << 1) & 0x1f);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (iVar3 < 4) {
      return 0;
    }
    for (s[2] = 0; s[2] < nVars; s[2] = s[2] + 1) {
      for (s[3] = s[2] + 1; iVar2 = s[3], s[3] < nVars; s[3] = s[3] + 1) {
        while (i[0] = iVar2 + 1, i[0] < nVars) {
          for (i[1] = iVar2 + 2; iVar2 = i[0], iVar3 = i[1], i[1] < nVars; i[1] = i[1] + 1) {
            while (i[2] = iVar3 + 1, i[2] < nVars) {
              for (i[3] = iVar3 + 2; iVar3 = i[2], i[3] < nVars; i[3] = i[3] + 1) {
                uVar4 = 1 << ((byte)(s[2] << 1) & 0x1f) | 1 << ((byte)(s[3] << 1) & 0x1f) |
                        1 << ((char)i[0] * '\x02' & 0x1fU) | 1 << ((byte)(i[1] << 1) & 0x1f) |
                        1 << ((char)i[2] * '\x02' & 0x1fU) | 1 << ((byte)(i[3] << 1) & 0x1f);
                for (local_78 = 0; iVar2 = local_78, local_78 < 6; local_78 = local_78 + 1) {
                  while (iVar3 = iVar2, local_74 = iVar3 + 1, local_74 < 6) {
                    for (s[0] = iVar3 + 2; iVar2 = local_74, s[0] < 6; s[0] = s[0] + 1) {
                      for (s[1] = iVar3 + 2; s[1] < 6; s[1] = s[1] + 1) {
                        iVar2 = If_ManSatCheckXY(pSat,6,pTruth,nVars,
                                                 uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) &
                                                              0x1f) |
                                                 3 << ((byte)(s[(long)local_74 + 2] << 1) & 0x1f) |
                                                 3 << ((byte)(s[(long)s[0] + 2] << 1) & 0x1f) |
                                                 3 << ((byte)(s[(long)s[1] + 2] << 1) & 0x1f),
                                                 (word *)0x0,(word *)0x0,vLits);
                        if (iVar2 != 0) {
                          return uVar4 | 3 << ((byte)(s[(long)local_78 + 2] << 1) & 0x1f) |
                                 3 << ((byte)(s[(long)local_74 + 2] << 1) & 0x1f) |
                                 3 << ((byte)(s[(long)s[0] + 2] << 1) & 0x1f) |
                                 3 << ((byte)(s[(long)s[1] + 2] << 1) & 0x1f);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

unsigned If_ManSatCheckXYall_int( void * pSat, int nLutSize, word * pTruth, int nVars, Vec_Int_t * vLits )
{
    unsigned uSet = 0;
    int nTotal = 2 * nLutSize - 1;
    int nShared = nTotal - nVars;
    int i[6], s[4];
    assert( nLutSize >= 2 && nLutSize <= 6 );
    assert( nLutSize < nVars && nVars <= nTotal );
    assert( nShared >= 0 && nShared < nLutSize - 1 );
    if ( nLutSize == 2 )
    {
        assert( nShared == 0 );
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
    }
    else if ( nLutSize == 3 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
    }
    else if ( nLutSize == 4 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
        if ( nShared < 2 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3]));
            {
                for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
                for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
                    if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])), NULL, NULL, vLits) )
                        return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]]));
            }
        }
    }
    else if ( nLutSize == 5 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
        if ( nShared < 2 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]]));
        }
        if ( nShared < 3 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
            for ( s[2] = s[1]+1; s[2] < nLutSize; s[2]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]]));
        }
    }
    else if ( nLutSize == 6 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
        if ( nShared < 2 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]]));
        }
        if ( nShared < 3 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
            for ( s[2] = s[1]+1; s[2] < nLutSize; s[2]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]]));
        }
        if ( nShared < 4 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
            for ( s[2] = s[1]+1; s[2] < nLutSize; s[2]++ )
            for ( s[3] = s[1]+1; s[3] < nLutSize; s[3]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])) | (3 << (2*i[s[3]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])) | (3 << (2*i[s[3]]));
        }
    }
    return 0;
}